

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_enc.cc
# Opt level: O2

bool woff2::ConvertTTFToWOFF2
               (uint8_t *data,size_t length,uint8_t *result,size_t *result_length,
               WOFF2Params *params)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint8_t *puVar2;
  _Base_ptr *this;
  uint32_t uVar3;
  pointer pFVar4;
  pointer pTVar5;
  bool bVar6;
  uint uVar7;
  Table *pTVar8;
  Table *pTVar9;
  _Base_ptr p_Var10;
  mapped_type *pmVar11;
  iterator iVar12;
  mapped_type_conflict *pmVar13;
  long lVar14;
  long lVar15;
  _Rb_tree_node_base *p_Var16;
  size_t sVar17;
  pointer pFVar18;
  _Base_ptr *pp_Var19;
  key_type kVar20;
  uint32_t uVar21;
  Font *font;
  Font *this_00;
  pointer pFVar22;
  ulong uVar23;
  ushort uVar24;
  const_iterator __begin3;
  long lVar25;
  key_type kVar26;
  char *__format;
  ulong uVar27;
  uint8_t *puVar28;
  Table *table;
  Font *pFVar29;
  uint *puVar30;
  uint *puVar31;
  pointer pTVar32;
  const_iterator __end3;
  size_t local_1c8;
  uint32_t compressed_metadata_buf_length;
  uint32_t total_compressed_length;
  uint8_t *local_1b8;
  Font *local_1b0;
  pointer local_1a8;
  uint tag;
  uint uStack_19c;
  uint32_t local_194;
  uint32_t local_190;
  vector<woff2::Table,_std::allocator<woff2::Table>_> tables;
  pair<unsigned_int,_unsigned_int> tag_offset;
  uint tag_1;
  FontCollection font_collection;
  pair<unsigned_int,_unsigned_int> tag_offset_1;
  uint *local_e8;
  map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
  index_by_tag_offset;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressed_metadata_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> transform_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compression_buf;
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
  local_60;
  
  font_collection.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &font_collection.tables._M_t._M_impl.super__Rb_tree_header._M_header;
  font_collection.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  font_collection.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  font_collection.tables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  font_collection.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  font_collection.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  font_collection.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8 = result;
  font_collection.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       font_collection.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar6 = ReadFontCollection(data,length,&font_collection);
  if (bVar6) {
    bVar6 = NormalizeFontCollection(&font_collection);
    if ((bVar6) &&
       ((this_00 = font_collection.fonts.
                   super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                   super__Vector_impl_data._M_start, pFVar18 = (pointer)params,
        pFVar29 = font_collection.fonts.
                  super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                  super__Vector_impl_data._M_finish, params->allow_transforms != true ||
        (bVar6 = TransformFontCollection(&font_collection),
        this_00 = font_collection.fonts.
                  super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                  super__Vector_impl_data._M_start, pFVar18 = (pointer)params,
        pFVar29 = font_collection.fonts.
                  super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                  super__Vector_impl_data._M_finish, bVar6)))) {
      for (; local_1a8 = pFVar18,
          pFVar18 = font_collection.fonts.
                    super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                    super__Vector_impl_data._M_finish, this_00 != pFVar29; this_00 = this_00 + 1) {
        pTVar8 = Font::FindTable(this_00,0x676c7966);
        pTVar9 = Font::FindTable(this_00,0x6c6f6361);
        if (pTVar8 != (Table *)0x0) {
          pTVar8->flag_byte = pTVar8->flag_byte | 0xc0;
        }
        if (pTVar9 != (Table *)0x0) {
          pTVar9->flag_byte = pTVar9->flag_byte | 0xc0;
        }
        pFVar18 = local_1a8;
      }
      pFVar29 = (Font *)0x0;
      for (pFVar22 = font_collection.fonts.
                     super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                     super__Vector_impl_data._M_start; pFVar22 != pFVar18; pFVar22 = pFVar22 + 1) {
        lVar25 = 0;
        for (p_Var10 = (pFVar22->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var10 != &(pFVar22->tables)._M_t._M_impl.super__Rb_tree_header;
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
          bVar6 = Font::Table::IsReused((Table *)&p_Var10[1]._M_parent);
          if ((!bVar6) &&
             ((uVar7 = *(uint *)&p_Var10[1]._M_parent, (uVar7 & 0x80808080) != 0 ||
              (pTVar8 = Font::FindTable(pFVar22,uVar7 | 0x80808080), pTVar8 == (Table *)0x0)))) {
            lVar25 = lVar25 + (ulong)*(uint *)((long)&p_Var10[1]._M_left + 4);
          }
        }
        pFVar29 = (Font *)((long)&pFVar29->flavor + lVar25);
      }
      uVar23 = (ulong)((double)((ulong)pFVar29 & 0xffffffff) * 1.2 + 10240.0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&compression_buf,uVar23 & 0xffffffff,(allocator_type *)&index_by_tag_offset);
      total_compressed_length = (uint32_t)uVar23;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&transform_buf,(size_type)pFVar29,(allocator_type *)&index_by_tag_offset);
      pFVar18 = font_collection.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      lVar25 = 0;
      local_1b0 = pFVar29;
      for (pFVar22 = font_collection.fonts.
                     super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                     super__Vector_impl_data._M_start; pFVar4 = local_1a8, pFVar29 = local_1b0,
          pFVar22 != pFVar18; pFVar22 = pFVar22 + 1) {
        Font::OutputOrderedTags
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&index_by_tag_offset,
                   pFVar22);
        puVar31 = (uint *)CONCAT44(index_by_tag_offset._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _4_4_,index_by_tag_offset._M_t._M_impl.super__Rb_tree_header.
                                         _M_header._M_color);
        for (puVar30 = (uint *)index_by_tag_offset._M_t._M_impl._0_8_; puVar30 != puVar31;
            puVar30 = puVar30 + 1) {
          tag = *puVar30;
          pmVar11 = std::
                    map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                    ::at(&pFVar22->tables,&tag);
          bVar6 = Font::Table::IsReused(pmVar11);
          if ((!bVar6) && (((ulong)_tag & 0x80808080) == 0)) {
            pTVar8 = Font::FindTable(pFVar22,tag | 0x80808080);
            if (pTVar8 != (Table *)0x0) {
              pmVar11 = pTVar8;
            }
            uVar7 = pmVar11->length;
            memcpy(transform_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar25,pmVar11->data,(ulong)uVar7);
            lVar25 = lVar25 + (ulong)uVar7;
          }
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&index_by_tag_offset
                  );
      }
      bVar6 = anon_unknown_0::Compress
                        (transform_buf.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,(size_t)local_1b0,
                         compression_buf.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,&total_compressed_length,BROTLI_MODE_FONT,
                         *(int *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)&(local_1a8->tables)._M_t._M_impl.super__Rb_tree_header + 1));
      if (bVar6) {
        fprintf(_stderr,"Compressed %zu to %u.\n",pFVar29,(ulong)total_compressed_length);
        uVar23 = (ulong)((double)*(uint *)&(pFVar4->tables)._M_t._M_impl * 1.2 + 10240.0);
        compressed_metadata_buf_length = (uint32_t)uVar23;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&compressed_metadata_buf,uVar23 & 0xffffffff,
                   (allocator_type *)&index_by_tag_offset);
        sVar17 = *(size_t *)&(pFVar4->tables)._M_t._M_impl;
        if (sVar17 == 0) {
          compressed_metadata_buf_length = 0;
LAB_0010f211:
          tables.super__Vector_base<woff2::Table,_std::allocator<woff2::Table>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          tables.super__Vector_base<woff2::Table,_std::allocator<woff2::Table>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          tables.super__Vector_base<woff2::Table,_std::allocator<woff2::Table>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          index_by_tag_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &index_by_tag_offset._M_t._M_impl.super__Rb_tree_header._M_header;
          index_by_tag_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          index_by_tag_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          index_by_tag_offset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1b0 = font_collection.fonts.
                      super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          index_by_tag_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               index_by_tag_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (pFVar18 = font_collection.fonts.
                         super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                         super__Vector_impl_data._M_start; pFVar18 != local_1b0;
              pFVar18 = pFVar18 + 1) {
            Font::OutputOrderedTags
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tag_offset_1,pFVar18)
            ;
            for (puVar31 = (uint *)CONCAT44(tag_offset_1.second,tag_offset_1.first);
                puVar31 != local_e8; puVar31 = puVar31 + 1) {
              tag_1 = *puVar31;
              pmVar11 = std::
                        map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                        ::at(&pFVar18->tables,&tag_1);
              bVar6 = Font::Table::IsReused(pmVar11);
              if (!bVar6) {
                tag_offset.first = pmVar11->tag;
                tag_offset.second = pmVar11->offset;
                iVar12 = std::
                         _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                         ::find(&index_by_tag_offset._M_t,&tag_offset);
                pTVar32 = tables.super__Vector_base<woff2::Table,_std::allocator<woff2::Table>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                pTVar5 = tables.super__Vector_base<woff2::Table,_std::allocator<woff2::Table>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                if ((_Rb_tree_header *)iVar12._M_node !=
                    &index_by_tag_offset._M_t._M_impl.super__Rb_tree_header) {
                  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &tag_offset_1);
                  bVar6 = false;
                  goto LAB_0010f3db;
                }
                pmVar13 = std::
                          map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                          ::operator[](&index_by_tag_offset,&tag_offset);
                *pmVar13 = (mapped_type_conflict)(((long)pTVar32 - (long)pTVar5) / 0x28);
                uStack_19c._0_1_ = pmVar11->flag_byte;
                tag = pmVar11->tag;
                uStack_19c._1_3_ = 0;
                local_194 = pmVar11->length;
                local_190 = local_194;
                pTVar8 = Font::FindTable(pFVar18,pmVar11->tag ^ 0x80808080);
                if (pTVar8 != (Table *)0x0) {
                  _tag = (key_type)((ulong)CONCAT14(pTVar8->flag_byte,tag) | 0x10000000000);
                  local_190 = pTVar8->length;
                }
                std::vector<woff2::Table,_std::allocator<woff2::Table>_>::push_back
                          (&tables,(value_type *)&tag);
              }
            }
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&tag_offset_1);
          }
          std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
          ::_Rb_tree(&local_60,&index_by_tag_offset._M_t);
          pTVar5 = tables.super__Vector_base<woff2::Table,_std::allocator<woff2::Table>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar3 = compressed_metadata_buf_length;
          local_1b0 = (Font *)(ulong)total_compressed_length;
          local_1c8 = (size_t)compressed_metadata_buf_length;
          lVar25 = 0x30;
          for (pTVar32 = tables.super__Vector_base<woff2::Table,_std::allocator<woff2::Table>_>.
                         _M_impl.super__Vector_impl_data._M_start; pTVar32 != pTVar5;
              pTVar32 = pTVar32 + 1) {
            uVar21 = pTVar32->tag;
            lVar14 = woff2::Base128Size((ulong)pTVar32->src_length);
            uVar7 = anon_unknown_0::KnownTableIndex(uVar21);
            lVar14 = lVar14 + (ulong)((~uVar7 & 0x3f) == 0) * 4 + 1;
            if ((pTVar32->flags & 0x100) != 0) {
              lVar15 = woff2::Base128Size((ulong)pTVar32->transform_length);
              lVar14 = lVar14 + lVar15;
            }
            lVar25 = lVar25 + lVar14;
          }
          if (font_collection.flavor == 0x74746366) {
            lVar14 = woff2::Size255UShort
                               ((ushort)(((long)font_collection.fonts.
                                                super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)font_collection.fonts.
                                               super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                                               ._M_impl.super__Vector_impl_data._M_start) / 0x38));
            pFVar18 = font_collection.fonts.
                      super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            lVar25 = lVar25 + lVar14 +
                     (((long)font_collection.fonts.
                             super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)font_collection.fonts.
                            super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x38) * 4 + 4;
            for (pFVar22 = font_collection.fonts.
                           super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                           super__Vector_impl_data._M_start; pFVar22 != pFVar18;
                pFVar22 = pFVar22 + 1) {
              lVar14 = woff2::Size255UShort
                                 ((ushort)(pFVar22->tables)._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count);
              lVar25 = lVar25 + lVar14;
              for (p_Var16 = (pFVar22->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var16 !=
                  &(pFVar22->tables)._M_t._M_impl.super__Rb_tree_header;
                  p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
                if ((*(uint *)&p_Var16[1]._M_parent & 0x80808080) == 0) {
                  uStack_19c = *(uint *)&p_Var16[1]._M_left;
                  tag = *(uint *)&p_Var16[1]._M_parent;
                  pmVar13 = std::
                            map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                            ::operator[]((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                                          *)&local_60,(key_type *)&tag);
                  lVar14 = woff2::Size255UShort(*pmVar13);
                  lVar25 = lVar25 + lVar14;
                }
              }
            }
          }
          uVar27 = (long)&local_1b0->flavor + lVar25;
          uVar23 = (long)&local_1b0->flavor + lVar25 + 3 & 0xfffffffffffffffc;
          if (0xfffffffffffffffc < uVar27) {
            uVar23 = uVar27;
          }
          kVar26 = (key_type)(uVar23 + local_1c8);
          std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
          ::~_Rb_tree(&local_60);
          puVar28 = local_1b8;
          kVar20 = (key_type)*result_length;
          if ((ulong)kVar20 < (ulong)kVar26) {
            __format = "Result allocation was too small (%zd vs %zd bytes).\n";
LAB_0010fa41:
            bVar6 = false;
            fprintf(_stderr,__format,kVar20,kVar26);
          }
          else {
            *result_length = (size_t)kVar26;
            tag = 4;
            uStack_19c = 0;
            builtin_memcpy(local_1b8,"wOF2",4);
            if (font_collection.flavor == 0x74746366) {
              tag = 8;
              uStack_19c = 0;
              builtin_memcpy(local_1b8 + 4,"ttcf",4);
            }
            else {
              StoreU32((font_collection.fonts.
                        super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                        super__Vector_impl_data._M_start)->flavor,(size_t *)&tag,local_1b8);
            }
            StoreU32(kVar26.first,(size_t *)&tag,puVar28);
            uVar24 = (ushort)(((long)tables.
                                     super__Vector_base<woff2::Table,_std::allocator<woff2::Table>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)tables.
                                    super__Vector_base<woff2::Table,_std::allocator<woff2::Table>_>.
                                    _M_impl.super__Vector_impl_data._M_start) / 0x28);
            *(ushort *)(puVar28 + (long)_tag) = uVar24 << 8 | uVar24 >> 8;
            (puVar28 + (long)_tag + 2)[0] = '\0';
            (puVar28 + (long)_tag + 2)[1] = '\0';
            _tag = (key_type)((long)_tag + 4);
            if (font_collection.flavor == 0x74746366) {
              lVar25 = woff2::CollectionHeaderSize
                                 (font_collection.header_version,
                                  (uint)(((long)font_collection.fonts.
                                                super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)font_collection.fonts.
                                               super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                                               ._M_impl.super__Vector_impl_data._M_start) / 0x38));
              pFVar18 = font_collection.fonts.
                        super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              puVar28 = local_1b8;
              for (pFVar22 = font_collection.fonts.
                             super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                             super__Vector_impl_data._M_start; uVar21 = (uint32_t)lVar25,
                  pFVar22 != pFVar18; pFVar22 = pFVar22 + 1) {
                sVar17 = anon_unknown_0::ComputeUncompressedLength(pFVar22);
                lVar25 = lVar25 + sVar17;
              }
            }
            else {
              sVar17 = anon_unknown_0::ComputeUncompressedLength
                                 (font_collection.fonts.
                                  super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              uVar21 = (uint32_t)sVar17;
              puVar28 = local_1b8;
            }
            StoreU32(uVar21,(size_t *)&tag,puVar28);
            StoreU32((uint32_t)local_1b0,(size_t *)&tag,puVar28);
            puVar2 = puVar28 + (long)_tag;
            puVar2[0] = '\0';
            puVar2[1] = '\x01';
            puVar2[2] = '\0';
            puVar2[3] = '\0';
            if (local_1c8 == 0) {
              puVar2 = puVar28 + (long)_tag + 4;
              puVar2[0] = '\0';
              puVar2[1] = '\0';
              puVar2[2] = '\0';
              puVar2[3] = '\0';
              puVar2[4] = '\0';
              puVar2[5] = '\0';
              puVar2[6] = '\0';
              puVar2[7] = '\0';
              puVar2 = puVar28 + (long)_tag + 0xc;
              puVar2[0] = '\0';
              puVar2[1] = '\0';
              puVar2[2] = '\0';
              puVar2[3] = '\0';
              _tag = (key_type)((long)_tag + 0x10);
            }
            else {
              _tag = (key_type)((long)_tag + 4);
              StoreU32(kVar26.first - uVar3,(size_t *)&tag,puVar28);
              StoreU32(uVar3,(size_t *)&tag,puVar28);
              StoreU32(*(uint32_t *)&(local_1a8->tables)._M_t._M_impl,(size_t *)&tag,puVar28);
            }
            pTVar5 = tables.super__Vector_base<woff2::Table,_std::allocator<woff2::Table>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            puVar28 = puVar28 + (long)_tag;
            puVar28[0] = '\0';
            puVar28[1] = '\0';
            puVar28[2] = '\0';
            puVar28[3] = '\0';
            puVar28[4] = '\0';
            puVar28[5] = '\0';
            puVar28[6] = '\0';
            puVar28[7] = '\0';
            _tag = (key_type)((long)_tag + 8);
            for (pTVar32 = tables.super__Vector_base<woff2::Table,_std::allocator<woff2::Table>_>.
                           _M_impl.super__Vector_impl_data._M_start; puVar28 = local_1b8,
                pTVar32 != pTVar5; pTVar32 = pTVar32 + 1) {
              uVar3 = pTVar32->flags;
              uVar7 = anon_unknown_0::KnownTableIndex(pTVar32->tag);
              puVar28 = local_1b8;
              kVar20 = (key_type)((long)_tag + 1);
              local_1b8[(long)_tag] = (byte)uVar3 & 0xc0 | (byte)uVar7;
              _tag = kVar20;
              if ((~uVar7 & 0x3f) == 0) {
                StoreU32(pTVar32->tag,(size_t *)&tag,local_1b8);
              }
              woff2::StoreBase128((ulong)pTVar32->src_length,(ulong *)&tag,puVar28);
              if ((pTVar32->flags & 0x100) != 0) {
                woff2::StoreBase128((ulong)pTVar32->transform_length,(ulong *)&tag,puVar28);
              }
            }
            if (font_collection.flavor == 0x74746366) {
              StoreU32(font_collection.header_version,(size_t *)&tag,local_1b8);
              woff2::Store255UShort
                        ((int)(((long)font_collection.fonts.
                                      super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)font_collection.fonts.
                                     super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                                     _M_impl.super__Vector_impl_data._M_start) / 0x38),(ulong *)&tag
                         ,puVar28);
              local_1a8 = font_collection.fonts.
                          super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              for (pFVar18 = font_collection.fonts.
                             super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                             super__Vector_impl_data._M_start; puVar28 = local_1b8,
                  pFVar18 != local_1a8; pFVar18 = pFVar18 + 1) {
                paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&(pFVar18->tables)._M_t._M_impl.super__Rb_tree_header;
                uVar24 = 0;
                for (p_Var16 = (_Rb_tree_node_base *)
                               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&(pFVar18->tables)._M_t._M_impl.super__Rb_tree_header)[1].
                               _M_allocated_capacity; p_Var16 != (_Rb_tree_node_base *)paVar1;
                    p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
                  uVar24 = uVar24 + (((ulong)p_Var16[1]._M_parent & 0x80808080) == 0);
                }
                woff2::Store255UShort((uint)uVar24,(ulong *)&tag,puVar28);
                StoreU32(*(uint32_t *)&(((string *)&pFVar18->flavor)->_M_dataplus)._M_p,
                         (size_t *)&tag,puVar28);
                for (p_Var16 = (_Rb_tree_node_base *)
                               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&(pFVar18->tables)._M_t._M_impl.super__Rb_tree_header)[1].
                               _M_allocated_capacity; p_Var16 != (_Rb_tree_node_base *)paVar1;
                    p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
                  if (((ulong)p_Var16[1]._M_parent & 0x80808080) == 0) {
                    this = &p_Var16[1]._M_parent;
                    bVar6 = Font::Table::IsReused((Table *)this);
                    pp_Var19 = &p_Var16[1]._M_left;
                    if (bVar6) {
                      pp_Var19 = &(p_Var16[2]._M_right)->_M_parent;
                    }
                    uVar7 = *(uint *)pp_Var19;
                    Font::Table::IsReused((Table *)this);
                    tag_offset_1.first = *(uint *)this;
                    tag_offset_1.second = uVar7;
                    iVar12 = std::
                             _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                             ::find(&index_by_tag_offset._M_t,&tag_offset_1);
                    if ((_Rb_tree_header *)iVar12._M_node ==
                        &index_by_tag_offset._M_t._M_impl.super__Rb_tree_header) {
                      bVar6 = false;
                      fprintf(_stderr,"Missing table index for offset 0x%08x\n",(ulong)uVar7);
                      goto LAB_0010f3db;
                    }
                    pmVar13 = std::
                              map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                              ::operator[](&index_by_tag_offset,&tag_offset_1);
                    woff2::Store255UShort((uint)*pmVar13,(ulong *)&tag,local_1b8);
                  }
                }
              }
              local_1b0 = (Font *)(ulong)total_compressed_length;
              local_1c8 = (size_t)compressed_metadata_buf_length;
            }
            kVar26 = _tag;
            pFVar29 = local_1b0;
            puVar28 = local_1b8;
            memcpy(local_1b8 + (long)_tag,
                   compression_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start,(size_t)local_1b0);
            kVar20 = (key_type)((long)&pFVar29->flavor + (long)kVar26);
            kVar26 = (key_type)((long)&pFVar29->flavor + (long)kVar26 + 3U & 0xfffffffffffffffc);
            if (0xfffffffffffffffc < (ulong)kVar20) {
              kVar26 = kVar20;
            }
            _tag = kVar26;
            memcpy(puVar28 + (long)kVar26,
                   compressed_metadata_buf.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,local_1c8);
            kVar26 = (key_type)((long)kVar26 + local_1c8);
            kVar20 = (key_type)*result_length;
            bVar6 = true;
            _tag = kVar26;
            if (kVar20 != kVar26) {
              __format = "Mismatch between computed and actual length (%zd vs %zd)\n";
              goto LAB_0010fa41;
            }
          }
LAB_0010f3db:
          std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
          ::~_Rb_tree(&index_by_tag_offset._M_t);
          std::_Vector_base<woff2::Table,_std::allocator<woff2::Table>_>::~_Vector_base
                    (&tables.super__Vector_base<woff2::Table,_std::allocator<woff2::Table>_>);
        }
        else {
          bVar6 = anon_unknown_0::Compress
                            (*(uint8_t **)pFVar4,sVar17,
                             compressed_metadata_buf.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             &compressed_metadata_buf_length,BROTLI_MODE_TEXT,
                             *(int *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)&(pFVar4->tables)._M_t._M_impl.super__Rb_tree_header + 1));
          if (bVar6) goto LAB_0010f211;
          fwrite("Compression of extended metadata failed.\n",0x29,1,_stderr);
          bVar6 = false;
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&compressed_metadata_buf.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      }
      else {
        fwrite("Compression of combined table failed.\n",0x26,1,_stderr);
        bVar6 = false;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&transform_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&compression_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
      ;
      goto LAB_0010eec9;
    }
  }
  else {
    fwrite("Parsing of the input font failed.\n",0x22,1,_stderr);
  }
  bVar6 = false;
LAB_0010eec9:
  FontCollection::~FontCollection(&font_collection);
  return bVar6;
}

Assistant:

bool ConvertTTFToWOFF2(const uint8_t *data, size_t length,
                       uint8_t *result, size_t *result_length,
                       const WOFF2Params& params) {
  FontCollection font_collection;
  if (!ReadFontCollection(data, length, &font_collection)) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Parsing of the input font failed.\n");
#endif
    return FONT_COMPRESSION_FAILURE();
  }

  if (!NormalizeFontCollection(&font_collection)) {
    return FONT_COMPRESSION_FAILURE();
  }

  if (params.allow_transforms && !TransformFontCollection(&font_collection)) {
    return FONT_COMPRESSION_FAILURE();
  } else {
    // glyf/loca use 11 to flag "not transformed"
    for (auto& font : font_collection.fonts) {
      Font::Table* glyf_table = font.FindTable(kGlyfTableTag);
      Font::Table* loca_table = font.FindTable(kLocaTableTag);
      if (glyf_table) {
        glyf_table->flag_byte |= 0xc0;
      }
      if (loca_table) {
        loca_table->flag_byte |= 0xc0;
      }
    }
  }

  // Although the compressed size of each table in the final woff2 file won't
  // be larger than its transform_length, we have to allocate a large enough
  // buffer for the compressor, since the compressor can potentially increase
  // the size. If the compressor overflows this, it should return false and
  // then this function will also return false.

  size_t total_transform_length = 0;
  for (const auto& font : font_collection.fonts) {
    total_transform_length += ComputeTotalTransformLength(font);
  }
  size_t compression_buffer_size = CompressedBufferSize(total_transform_length);
  std::vector<uint8_t> compression_buf(compression_buffer_size);
  uint32_t total_compressed_length = compression_buffer_size;

  // Collect all transformed data into one place in output order.
  std::vector<uint8_t> transform_buf(total_transform_length);
  size_t transform_offset = 0;
  for (const auto& font : font_collection.fonts) {
    for (const auto tag : font.OutputOrderedTags()) {
      const Font::Table& original = font.tables.at(tag);
      if (original.IsReused()) continue;
      if (tag & 0x80808080) continue;
      const Font::Table* table_to_store = font.FindTable(tag ^ 0x80808080);
      if (table_to_store == NULL) table_to_store = &original;

      StoreBytes(table_to_store->data, table_to_store->length,
                 &transform_offset, &transform_buf[0]);
    }
  }

  // Compress all transformed data in one stream.
  if (!Woff2Compress(transform_buf.data(), total_transform_length,
                     &compression_buf[0],
                     &total_compressed_length,
                     params.brotli_quality)) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Compression of combined table failed.\n");
#endif
    return FONT_COMPRESSION_FAILURE();
  }

#ifdef FONT_COMPRESSION_BIN
  fprintf(stderr, "Compressed %zu to %u.\n", total_transform_length,
          total_compressed_length);
#endif

  // Compress the extended metadata
  // TODO(user): how does this apply to collections
  uint32_t compressed_metadata_buf_length =
    CompressedBufferSize(params.extended_metadata.length());
  std::vector<uint8_t> compressed_metadata_buf(compressed_metadata_buf_length);

  if (params.extended_metadata.length() > 0) {
    if (!TextCompress((const uint8_t*)params.extended_metadata.data(),
                      params.extended_metadata.length(),
                      compressed_metadata_buf.data(),
                      &compressed_metadata_buf_length,
                      params.brotli_quality)) {
#ifdef FONT_COMPRESSION_BIN
      fprintf(stderr, "Compression of extended metadata failed.\n");
#endif
      return FONT_COMPRESSION_FAILURE();
    }
  } else {
    compressed_metadata_buf_length = 0;
  }

  std::vector<Table> tables;
  std::map<std::pair<uint32_t, uint32_t>, uint16_t> index_by_tag_offset;

  for (const auto& font : font_collection.fonts) {

    for (const auto tag : font.OutputOrderedTags()) {
      const Font::Table& src_table = font.tables.at(tag);
      if (src_table.IsReused()) {
        continue;
      }

      std::pair<uint32_t, uint32_t> tag_offset(src_table.tag, src_table.offset);
      if (index_by_tag_offset.find(tag_offset) == index_by_tag_offset.end()) {
        index_by_tag_offset[tag_offset] = tables.size();
      } else {
        return false;
      }

      Table table;
      table.tag = src_table.tag;
      table.flags = src_table.flag_byte;
      table.src_length = src_table.length;
      table.transform_length = src_table.length;
      const uint8_t* transformed_data = src_table.data;
      const Font::Table* transformed_table =
          font.FindTable(src_table.tag ^ 0x80808080);
      if (transformed_table != NULL) {
        table.flags = transformed_table->flag_byte;
        table.flags |= kWoff2FlagsTransform;
        table.transform_length = transformed_table->length;
        transformed_data = transformed_table->data;

      }
      tables.push_back(table);
    }
  }

  size_t woff2_length = ComputeWoff2Length(font_collection, tables,
      index_by_tag_offset, total_compressed_length,
      compressed_metadata_buf_length);
  if (woff2_length > *result_length) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Result allocation was too small (%zd vs %zd bytes).\n",
           *result_length, woff2_length);
#endif
    return FONT_COMPRESSION_FAILURE();
  }
  *result_length = woff2_length;

  size_t offset = 0;

  // start of woff2 header (http://www.w3.org/TR/WOFF2/#woff20Header)
  StoreU32(kWoff2Signature, &offset, result);
  if (font_collection.flavor != kTtcFontFlavor) {
    StoreU32(font_collection.fonts[0].flavor, &offset, result);
  } else {
    StoreU32(kTtcFontFlavor, &offset, result);
  }
  StoreU32(woff2_length, &offset, result);
  Store16(tables.size(), &offset, result);
  Store16(0, &offset, result);  // reserved
  // totalSfntSize
  StoreU32(ComputeUncompressedLength(font_collection), &offset, result);
  StoreU32(total_compressed_length, &offset, result);  // totalCompressedSize

  // Let's just all be v1.0
  Store16(1, &offset, result);  // majorVersion
  Store16(0, &offset, result);  // minorVersion
  if (compressed_metadata_buf_length > 0) {
    StoreU32(woff2_length - compressed_metadata_buf_length,
             &offset, result);  // metaOffset
    StoreU32(compressed_metadata_buf_length, &offset, result);  // metaLength
    StoreU32(params.extended_metadata.length(),
             &offset, result);  // metaOrigLength
  } else {
    StoreU32(0, &offset, result);  // metaOffset
    StoreU32(0, &offset, result);  // metaLength
    StoreU32(0, &offset, result);  // metaOrigLength
  }
  StoreU32(0, &offset, result);  // privOffset
  StoreU32(0, &offset, result);  // privLength
  // end of woff2 header

  // table directory (http://www.w3.org/TR/WOFF2/#table_dir_format)
  for (const auto& table : tables) {
    StoreTableEntry(table, &offset, result);
  }

  // for collections only, collection table directory
  if (font_collection.flavor == kTtcFontFlavor) {
    StoreU32(font_collection.header_version, &offset, result);
    Store255UShort(font_collection.fonts.size(), &offset, result);
    for (const Font& font : font_collection.fonts) {

      uint16_t num_tables = 0;
      for (const auto& entry : font.tables) {
        const Font::Table& table = entry.second;
        if (table.tag & 0x80808080) continue;  // don't write xform tables
        num_tables++;
      }
      Store255UShort(num_tables, &offset, result);

      StoreU32(font.flavor, &offset, result);
      for (const auto& entry : font.tables) {
        const Font::Table& table = entry.second;
        if (table.tag & 0x80808080) continue;  // don't write xform tables

        // for reused tables, only the original has an updated offset
        uint32_t table_offset =
          table.IsReused() ? table.reuse_of->offset : table.offset;
        uint32_t table_length =
          table.IsReused() ? table.reuse_of->length : table.length;
        std::pair<uint32_t, uint32_t> tag_offset(table.tag, table_offset);
        if (index_by_tag_offset.find(tag_offset) == index_by_tag_offset.end()) {
#ifdef FONT_COMPRESSION_BIN
fprintf(stderr, "Missing table index for offset 0x%08x\n",
                  table_offset);
#endif
          return FONT_COMPRESSION_FAILURE();
        }
        uint16_t index = index_by_tag_offset[tag_offset];
        Store255UShort(index, &offset, result);

      }

    }
  }

  // compressed data format (http://www.w3.org/TR/WOFF2/#table_format)

  StoreBytes(&compression_buf[0], total_compressed_length, &offset, result);
  offset = Round4(offset);

  StoreBytes(compressed_metadata_buf.data(), compressed_metadata_buf_length,
             &offset, result);

  if (*result_length != offset) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Mismatch between computed and actual length "
            "(%zd vs %zd)\n", *result_length, offset);
#endif
    return FONT_COMPRESSION_FAILURE();
  }
  return true;
}